

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O1

char * rnndec_decodeval(rnndeccontext *ctx,rnntypeinfo *ti,uint64_t value,int width)

{
  rnnvalue **pprVar1;
  rnnvalue *prVar2;
  rnnbitfield **pprVar3;
  rnnbitfield *prVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  rnnvalue ***ppprVar8;
  rnnbitfield ***ppprVar9;
  char *pcVar10;
  rnndeccolors *prVar11;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  double dVar15;
  char **__ptr;
  char *__fmt;
  int *piVar16;
  char *pcVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  char *res;
  char *tmp;
  char *local_58;
  char *local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  pcVar10 = (char *)(ulong)(uint)width;
code_r0x00106bfe:
  uVar18 = value >> 0x20;
  local_58 = (char *)0x0;
  if (ti != (rnntypeinfo *)0x0) {
    iVar7 = ti->shr;
    uVar19 = value << ((byte)iVar7 & 0x3f);
    uVar21 = uVar19;
    if (iVar7 == 0) {
      uVar21 = value;
    }
    uVar20 = uVar21 & 0xffffffff;
    uVar19 = uVar19 >> 0x20;
    if (iVar7 == 0) {
      uVar19 = uVar18;
    }
    uVar18 = uVar19;
    uVar19 = uVar20;
    switch(ti->type) {
    case RNN_TTYPE_INLINE_ENUM:
      ppprVar8 = &ti->vals;
      piVar16 = &ti->valsnum;
      break;
    case RNN_TTYPE_INLINE_BITSET:
      ppprVar9 = &ti->bitfields;
      piVar16 = &ti->bitfieldsnum;
      goto LAB_00106dd5;
    case RNN_TTYPE_ENUM:
      ppprVar8 = &ti->eenum->vals;
      piVar16 = &ti->eenum->valsnum;
      break;
    case RNN_TTYPE_BITSET:
      ppprVar9 = &ti->ebitset->bitfields;
      piVar16 = &ti->ebitset->bitfieldsnum;
LAB_00106dd5:
      lVar14 = (long)*piVar16;
      local_40 = lVar14;
      if (0 < lVar14) {
        pprVar3 = *ppprVar9;
        local_38 = uVar20 | uVar18 << 0x20;
        lVar22 = 0;
        uVar21 = 0;
        local_48 = uVar20;
        goto LAB_00106e0b;
      }
      uVar21 = 0xffffffffffffffff;
      goto LAB_00106fd9;
    case RNN_TTYPE_SPECTYPE:
      goto switchD_00106c56_caseD_4;
    case RNN_TTYPE_HEX:
      prVar11 = ctx->colors;
      pcVar12 = (char *)(uVar20 | uVar18 << 0x20);
      pcVar17 = prVar11->cimm;
      goto LAB_00106c7c;
    case RNN_TTYPE_INT:
      uVar20 = uVar20 | uVar18 << 0x20;
      prVar11 = ctx->colors;
      if ((uVar20 >> ((ulong)(width - 1U & 0xff) & 0x3f) & 1) == 0) {
        pcVar10 = prVar11->cend;
        pcVar17 = "%s%li%s";
      }
      else {
        uVar20 = (1L << ((byte)width & 0x3f)) - uVar20;
        pcVar10 = prVar11->cend;
        pcVar17 = "%s-%li%s";
      }
      asprintf(&local_58,pcVar17,prVar11->cimm,uVar20,pcVar10);
      return local_58;
    case RNN_TTYPE_UINT:
      pcVar12 = (char *)(uVar20 | uVar18 << 0x20);
      pcVar17 = ctx->colors->cimm;
      pcVar10 = ctx->colors->cend;
      __fmt = "%s%lu%s";
      goto LAB_00106c87;
    case RNN_TTYPE_FLOAT:
switchD_00106c56_caseD_8:
      if (width == 0x20) {
        prVar11 = ctx->colors;
        dVar15 = (double)(float)uVar21;
LAB_001070a2:
        asprintf(&local_58,"%s%f%s",dVar15,prVar11->cimm);
        bVar5 = false;
        pcVar10 = local_58;
      }
      else {
        if (width == 0x40) {
          prVar11 = ctx->colors;
          dVar15 = (double)(uVar20 | uVar18 << 0x20);
          goto LAB_001070a2;
        }
        bVar5 = true;
      }
      if (!bVar5) {
        return pcVar10;
      }
      goto switchD_00106c56_default;
    case RNN_TTYPE_BOOLEAN:
      uVar13 = uVar20 | uVar18 << 0x20;
      if (uVar13 == 1) {
        pcVar10 = ctx->colors->cbool;
        pcVar17 = ctx->colors->cend;
        pcVar12 = "%sTRUE%s";
      }
      else {
        if (uVar13 != 0) goto switchD_00106c56_caseD_8;
        pcVar10 = ctx->colors->cbool;
        pcVar17 = ctx->colors->cend;
        pcVar12 = "%sFALSE%s";
      }
      __ptr = &local_58;
      asprintf(__ptr,pcVar12,pcVar10,pcVar17);
      goto LAB_00106c96;
    default:
      goto switchD_00106c56_default;
    }
    iVar7 = *piVar16;
    if ((long)iVar7 < 1) goto switchD_00106c56_default;
    pprVar1 = *ppprVar8;
    lVar14 = 0;
    local_48 = uVar20;
    goto LAB_00106d63;
  }
  uVar19 = value & 0xffffffff;
  goto switchD_00106c56_default;
switchD_00106c56_caseD_4:
  ti = &ti->spectype->typeinfo;
  value = uVar20 | uVar18 << 0x20;
  goto code_r0x00106bfe;
LAB_00106e0b:
  do {
    iVar7 = rnndec_varmatch(ctx,&pprVar3[lVar22]->varinfo);
    if (iVar7 != 0) {
      prVar4 = pprVar3[lVar22];
      uVar19 = (prVar4->mask & local_38) >> ((byte)prVar4->low & 0x3f);
      uVar21 = uVar21 | prVar4->mask;
      if ((prVar4->typeinfo).type == RNN_TTYPE_BOOLEAN) {
        if (uVar19 != 0) {
          if (uVar19 != 1) goto LAB_00106e9c;
          if (local_58 == (char *)0x0) {
            asprintf(&local_58,"%s%s%s",ctx->colors->cbool,prVar4->name,ctx->colors->cend);
          }
          else {
            asprintf(&local_50,"%s | %s%s%s",local_58,ctx->colors->cbool,prVar4->name,
                     ctx->colors->cend);
            free(local_58);
            local_58 = local_50;
          }
        }
      }
      else {
LAB_00106e9c:
        pcVar10 = rnndec_decodeval(ctx,&prVar4->typeinfo,uVar19,(prVar4->high - prVar4->low) + 1);
        if (local_58 == (char *)0x0) {
          asprintf(&local_58,"%s%s%s = %s",ctx->colors->cname,pprVar3[lVar22]->name,
                   ctx->colors->cend,pcVar10);
        }
        else {
          asprintf(&local_50,"%s | %s%s%s = %s",local_58,ctx->colors->cname,pprVar3[lVar22]->name,
                   ctx->colors->cend,pcVar10);
          free(local_58);
          local_58 = local_50;
        }
        free(pcVar10);
        lVar14 = local_40;
      }
    }
    lVar22 = lVar22 + 1;
  } while (lVar14 != lVar22);
  uVar21 = ~uVar21;
  uVar20 = local_48;
LAB_00106fd9:
  uVar21 = (uVar20 & 0xffffffff | uVar18 << 0x20) & uVar21;
  if (uVar21 != 0) {
    if (local_58 == (char *)0x0) {
      asprintf(&local_58,"%s%#lx%s",ctx->colors->cerr,uVar21,ctx->colors->cend);
    }
    else {
      asprintf(&local_50,"%s | %s%#lx%s");
      free(local_58);
      local_58 = local_50;
    }
  }
  if (local_58 == (char *)0x0) {
    asprintf(&local_58,"%s0%s",ctx->colors->cimm,ctx->colors->cend);
  }
  __ptr = &local_50;
  asprintf(__ptr,"{ %s }",local_58);
  free(local_58);
  goto LAB_00106c96;
  while (lVar14 = lVar14 + 1, uVar19 = local_48, iVar7 != lVar14) {
LAB_00106d63:
    iVar6 = rnndec_varmatch(ctx,&pprVar1[lVar14]->varinfo);
    if (((iVar6 != 0) && (prVar2 = pprVar1[lVar14], prVar2->valvalid != 0)) &&
       (prVar2->value == (uVar20 | uVar18 << 0x20))) {
      pcVar12 = prVar2->name;
      pcVar17 = ctx->colors->ceval;
      pcVar10 = ctx->colors->cend;
      __fmt = "%s%s%s";
      goto LAB_00106c87;
    }
  }
switchD_00106c56_default:
  prVar11 = ctx->colors;
  pcVar12 = (char *)(uVar19 & 0xffffffff | uVar18 << 0x20);
  pcVar17 = prVar11->cerr;
LAB_00106c7c:
  pcVar10 = prVar11->cend;
  __fmt = "%s%#lx%s";
LAB_00106c87:
  __ptr = &local_58;
  asprintf(__ptr,__fmt,pcVar17,pcVar12,pcVar10);
LAB_00106c96:
  return *__ptr;
}

Assistant:

char *rnndec_decodeval(struct rnndeccontext *ctx, struct rnntypeinfo *ti, uint64_t value, int width) {
	char *res = 0;
	int i;
	struct rnnvalue **vals;
	int valsnum;
	struct rnnbitfield **bitfields;
	int bitfieldsnum;
	char *tmp;
	uint64_t mask;
	if (!ti)
		goto failhex;
	if (ti->shr) value <<= ti->shr;
	switch (ti->type) {
		case RNN_TTYPE_ENUM:
			vals = ti->eenum->vals;
			valsnum = ti->eenum->valsnum;
			goto doenum;
		case RNN_TTYPE_INLINE_ENUM:
			vals = ti->vals;
			valsnum = ti->valsnum;
			goto doenum;
		doenum:
			for (i = 0; i < valsnum; i++)
				if (rnndec_varmatch(ctx, &vals[i]->varinfo) && vals[i]->valvalid && vals[i]->value == value) {
					asprintf (&res, "%s%s%s", ctx->colors->ceval, vals[i]->name, ctx->colors->cend);
					return res;
				}
			goto failhex;
		case RNN_TTYPE_BITSET:
			bitfields = ti->ebitset->bitfields;
			bitfieldsnum = ti->ebitset->bitfieldsnum;
			goto dobitset;
		case RNN_TTYPE_INLINE_BITSET:
			bitfields = ti->bitfields;
			bitfieldsnum = ti->bitfieldsnum;
			goto dobitset;
		dobitset:
			mask = 0;
			for (i = 0; i < bitfieldsnum; i++) {
				if (!rnndec_varmatch(ctx, &bitfields[i]->varinfo))
					continue;
				uint64_t sval = (value & bitfields[i]->mask) >> bitfields[i]->low;
				mask |= bitfields[i]->mask;
				if (bitfields[i]->typeinfo.type == RNN_TTYPE_BOOLEAN) {
					if (sval == 0)
						continue;
					else if (sval == 1) {
						if (!res)
							asprintf (&res, "%s%s%s", ctx->colors->cbool, bitfields[i]->name, ctx->colors->cend);
						else {
							asprintf (&tmp, "%s | %s%s%s", res, ctx->colors->cbool, bitfields[i]->name, ctx->colors->cend);
							free(res);
							res = tmp;
						}
						continue;
					}
				}
				char *subval = rnndec_decodeval(ctx, &bitfields[i]->typeinfo, sval, bitfields[i]->high - bitfields[i]->low + 1);
				if (!res)
					asprintf (&res, "%s%s%s = %s", ctx->colors->cname, bitfields[i]->name, ctx->colors->cend, subval);
				else {
					asprintf (&tmp, "%s | %s%s%s = %s", res, ctx->colors->cname, bitfields[i]->name, ctx->colors->cend, subval);
					free(res);
					res = tmp;
				}
				free(subval);
			}
			if (value & ~mask) {
				if (!res)
					asprintf (&res, "%s%#"PRIx64"%s", ctx->colors->cerr, value & ~mask, ctx->colors->cend);
				else {
					asprintf (&tmp, "%s | %s%#"PRIx64"%s", res, ctx->colors->cerr, value & ~mask, ctx->colors->cend);
					free(res);
					res = tmp;
				}
			}
			if (!res)
				asprintf (&res, "%s0%s", ctx->colors->cimm, ctx->colors->cend);
			asprintf (&tmp, "{ %s }", res);
			free(res);
			return tmp;
		case RNN_TTYPE_SPECTYPE:
			return rnndec_decodeval(ctx, &ti->spectype->typeinfo, value, width);
		case RNN_TTYPE_HEX:
			asprintf (&res, "%s%#"PRIx64"%s", ctx->colors->cimm, value, ctx->colors->cend);
			return res;
		case RNN_TTYPE_UINT:
			asprintf (&res, "%s%"PRIu64"%s", ctx->colors->cimm, value, ctx->colors->cend);
			return res;
		case RNN_TTYPE_INT:
			if (value & UINT64_C(1) << (width-1))
				asprintf (&res, "%s-%"PRIi64"%s", ctx->colors->cimm, (UINT64_C(1) << width) - value, ctx->colors->cend);
			else
				asprintf (&res, "%s%"PRIi64"%s", ctx->colors->cimm, value, ctx->colors->cend);
			return res;
		case RNN_TTYPE_BOOLEAN:
			if (value == 0) {
				asprintf (&res, "%sFALSE%s", ctx->colors->cbool, ctx->colors->cend);
				return res;
			} else if (value == 1) {
				asprintf (&res, "%sTRUE%s", ctx->colors->cbool, ctx->colors->cend);
				return res;
			}
		case RNN_TTYPE_FLOAT: {
			union { uint64_t i; float f; double d; } val;
			val.i = value;
			if (width == 64)
				asprintf(&res, "%s%f%s", ctx->colors->cimm,
					val.d, ctx->colors->cend);
			else if (width == 32)
				asprintf(&res, "%s%f%s", ctx->colors->cimm,
					val.f, ctx->colors->cend);
			else
				goto failhex;

			return res;
		}
		failhex:
		default:
			asprintf (&res, "%s%#"PRIx64"%s", ctx->colors->cerr, value, ctx->colors->cend);
			return res;
			break;
	}
}